

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctcl__is_option(fctcl_t *clo,char *option)

{
  int iVar1;
  bool local_22;
  bool local_21;
  char *option_local;
  fctcl_t *clo_local;
  
  if (clo == (fctcl_t *)0x0) {
    __assert_fail("clo != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x5f0
                  ,"int fctcl__is_option(const fctcl_t *, const char *)");
  }
  if (option == (char *)0x0) {
    return 0;
  }
  if (clo->long_opt != (char *)0x0) {
    iVar1 = fctstr_eq(clo->long_opt,option);
    local_21 = true;
    if (iVar1 != 0) goto LAB_0011055e;
  }
  local_22 = false;
  if (clo->short_opt != (char *)0x0) {
    iVar1 = fctstr_eq(clo->short_opt,option);
    local_22 = iVar1 != 0;
  }
  local_21 = local_22;
LAB_0011055e:
  return (uint)local_21;
}

Assistant:

static int
fctcl__is_option(fctcl_t const *clo, char const *option)
{
    FCT_ASSERT( clo != NULL );
    if ( option == NULL )
    {
        return 0;
    }
    return ((clo->long_opt != NULL
             && fctstr_eq(clo->long_opt, option))
            ||
            (clo->short_opt != NULL
             && fctstr_eq(clo->short_opt, option))
           );
}